

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O2

bool s2shapeutil::CompactEncodeShape(S2Shape *shape,Encoder *encoder)

{
  int iVar1;
  Shape *this;
  S2LaxPolylineShape *this_00;
  S2PointVectorShape *this_01;
  S2LaxPolygonShape *this_02;
  
  iVar1 = (*shape->_vptr_S2Shape[10])();
  switch(iVar1) {
  case 1:
    this = down_cast<S2Polygon::Shape_const*,S2Shape_const>(shape);
    S2Polygon::Shape::Encode(this,encoder);
    break;
  default:
    FastEncodeShape(shape,encoder);
    break;
  case 3:
    this_01 = down_cast<S2PointVectorShape_const*,S2Shape_const>(shape);
    S2PointVectorShape::Encode(this_01,encoder,COMPACT);
    break;
  case 4:
    this_00 = down_cast<S2LaxPolylineShape_const*,S2Shape_const>(shape);
    S2LaxPolylineShape::Encode(this_00,encoder,COMPACT);
    break;
  case 5:
    this_02 = down_cast<S2LaxPolygonShape_const*,S2Shape_const>(shape);
    S2LaxPolygonShape::Encode(this_02,encoder,COMPACT);
  }
  return true;
}

Assistant:

bool CompactEncodeShape(const S2Shape& shape, Encoder* encoder) {
  switch (shape.type_tag()) {
    case S2Polygon::Shape::kTypeTag: {
      down_cast<const S2Polygon::Shape*>(&shape)->Encode(encoder);
      return true;
    }
    case S2PointVectorShape::kTypeTag: {
      down_cast<const S2PointVectorShape*>(&shape)->Encode(
          encoder, CodingHint::COMPACT);
      return true;
    }
    case S2LaxPolylineShape::kTypeTag: {
      down_cast<const S2LaxPolylineShape*>(&shape)->Encode(
          encoder, CodingHint::COMPACT);
      return true;
    }
    case S2LaxPolygonShape::kTypeTag: {
      down_cast<const S2LaxPolygonShape*>(&shape)->Encode(
          encoder, CodingHint::COMPACT);
      return true;
    }
    default: {
      return FastEncodeShape(shape, encoder);
    }
  }
}